

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_shl8v_aarch64(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; oprsz != uVar1; uVar1 = uVar1 + 1) {
    *(char *)((long)d + uVar1) = *(char *)((long)a + uVar1) << (*(byte *)((long)b + uVar1) & 7);
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_shl8v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        uint8_t sh = *(uint8_t *)((char *)b + i) & 7;
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) << sh;
    }
    clear_high(d, oprsz, desc);
}